

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_arg.cxx
# Opt level: O2

void __thiscall Fl_Window::show(Fl_Window *this,int argc,char **argv)

{
  char cVar1;
  uint H;
  Fl_Widget *pFVar2;
  int iVar3;
  uint uVar4;
  Fl_Window *pFVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  Window WVar11;
  ulong uVar12;
  ulong uVar13;
  uint gh;
  uint gw;
  int gy;
  int gx;
  
  if ((argc != 0) && ((arg_called & 1) == 0)) {
    Fl::args(argc,argv);
  }
  Fl::get_system_colors();
  pFVar5 = Fl::first_window();
  if (pFVar5 == (Fl_Window *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    pFVar5 = Fl::first_window();
    pcVar6 = xclass(pFVar5);
  }
  pcVar8 = "fltk";
  if (pcVar6 != (char *)0x0) {
    pcVar8 = pcVar6;
  }
  pcVar6 = (char *)XGetDefault(fl_display,pcVar8,"dndTextOps");
  if (pcVar6 != (char *)0x0) {
    uVar10 = 1;
    iVar3 = strcasecmp(pcVar6,"true");
    if (iVar3 != 0) {
      iVar3 = strcasecmp(pcVar6,"on");
      if (iVar3 != 0) {
        iVar3 = strcasecmp(pcVar6,"yes");
        uVar10 = (uint)(iVar3 == 0);
      }
    }
    Fl::dnd_text_ops(uVar10);
  }
  pcVar6 = (char *)XGetDefault(fl_display,pcVar8,"tooltips");
  if (pcVar6 != (char *)0x0) {
    iVar3 = strcasecmp(pcVar6,"true");
    uVar10 = 1;
    if (iVar3 != 0) {
      iVar3 = strcasecmp(pcVar6,"on");
      if (iVar3 != 0) {
        iVar3 = strcasecmp(pcVar6,"yes");
        uVar10 = (uint)(iVar3 == 0);
      }
    }
    Fl_Tooltip::enable(uVar10);
  }
  pcVar6 = (char *)XGetDefault(fl_display,pcVar8,"visibleFocus");
  if (pcVar6 != (char *)0x0) {
    iVar3 = strcasecmp(pcVar6,"true");
    uVar10 = 1;
    if (iVar3 != 0) {
      iVar3 = strcasecmp(pcVar6,"on");
      if (iVar3 != 0) {
        iVar3 = strcasecmp(pcVar6,"yes");
        uVar10 = (uint)(iVar3 == 0);
      }
    }
    Fl::visible_focus(uVar10);
  }
  if (geometry != (char *)0x0 && (show(int,char**)::beenhere & 1) == 0) {
    gx = (this->super_Fl_Group).super_Fl_Widget.x_;
    gy = (this->super_Fl_Group).super_Fl_Widget.y_;
    uVar10 = (this->super_Fl_Group).super_Fl_Widget.w_;
    H = (this->super_Fl_Group).super_Fl_Widget.h_;
    uVar4 = XParseGeometry();
    if ((uVar4 & 0x10) != 0) {
      iVar3 = Fl::w();
      gx = gx + (iVar3 - (this->super_Fl_Group).super_Fl_Widget.w_);
    }
    if ((uVar4 & 0x20) != 0) {
      iVar3 = Fl::h();
      gy = gy + (iVar3 - (this->super_Fl_Group).super_Fl_Widget.h_);
    }
    pFVar2 = (this->super_Fl_Group).resizable_;
    if (pFVar2 == (Fl_Widget *)0x0) {
      (this->super_Fl_Group).resizable_ = (Fl_Widget *)this;
    }
    if ((uVar4 & 3) == 0) {
      Fl_Widget::size((Fl_Widget *)this,uVar10,H);
    }
    else {
      (this->super_Fl_Group).super_Fl_Widget.x_ = -1;
      (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[4])
                (this,(ulong)(uint)gx,(ulong)(uint)gy,(ulong)uVar10,(ulong)H);
    }
    (this->super_Fl_Group).resizable_ = pFVar2;
  }
  if (::name == (char *)0x0) {
    pcVar6 = xclass(this);
    if (pcVar6 == (char *)0x0) {
      pcVar6 = fl_filename_name(*argv);
      xclass(this,pcVar6);
    }
  }
  else {
    xclass(this,::name);
    ::name = (char *)0x0;
  }
  if (title == (char *)0x0) {
    if ((this->super_Fl_Group).super_Fl_Widget.label_.value == (char *)0x0) {
      pcVar6 = xclass(this);
      label(this,pcVar6);
    }
  }
  else {
    label(this,title);
    title = (char *)0x0;
  }
  if (show(int,char**)::beenhere == 0) {
    show(int,char**)::beenhere = 1;
    Fl::scheme(Fl::scheme_);
  }
  (*(this->super_Fl_Group).super_Fl_Widget._vptr_Fl_Widget[5])(this);
  uVar12 = 0;
  uVar13 = (ulong)(uint)argc;
  if (argc < 1) {
    uVar13 = uVar12;
  }
  iVar3 = 0;
  for (; uVar13 != uVar12; uVar12 = uVar12 + 1) {
    sVar7 = strlen(argv[uVar12]);
    iVar3 = iVar3 + (int)sVar7 + 1;
  }
  pcVar8 = (char *)operator_new__((long)iVar3);
  pcVar6 = pcVar8;
  for (uVar12 = 0; uVar12 != uVar13; uVar12 = uVar12 + 1) {
    pcVar9 = argv[uVar12];
    do {
      cVar1 = *pcVar9;
      pcVar9 = pcVar9 + 1;
      *pcVar6 = cVar1;
      pcVar6 = pcVar6 + 1;
    } while (cVar1 != '\0');
  }
  if (this->i == (Fl_X *)0x0) {
    WVar11 = 0;
  }
  else {
    WVar11 = this->i->xid;
  }
  XChangeProperty(fl_display,WVar11,0x22,0x1f,8,0,pcVar8,(int)pcVar6 + ~(uint)pcVar8);
  operator_delete__(pcVar8);
  return;
}

Assistant:

void Fl_Window::show(int argc, char **argv) {
  if (argc && !arg_called) Fl::args(argc,argv);

  Fl::get_system_colors();

#if !defined(WIN32) && !defined(__APPLE__)
  // Get defaults for drag-n-drop and focus...
  const char *key = 0, *val;

  if (Fl::first_window()) key = Fl::first_window()->xclass();
  if (!key) key = "fltk";

  val = XGetDefault(fl_display, key, "dndTextOps");
  if (val) Fl::dnd_text_ops(strcasecmp(val, "true") == 0 ||
                            strcasecmp(val, "on") == 0 ||
                            strcasecmp(val, "yes") == 0);

  val = XGetDefault(fl_display, key, "tooltips");
  if (val) Fl_Tooltip::enable(strcasecmp(val, "true") == 0 ||
                              strcasecmp(val, "on") == 0 ||
                              strcasecmp(val, "yes") == 0);

  val = XGetDefault(fl_display, key, "visibleFocus");
  if (val) Fl::visible_focus(strcasecmp(val, "true") == 0 ||
                             strcasecmp(val, "on") == 0 ||
                             strcasecmp(val, "yes") == 0);
#endif // !WIN32 && !__APPLE__

  // set colors first, so background_pixel is correct:
  static char beenhere;
  if (!beenhere) {
    if (geometry) {
      int fl = 0, gx = x(), gy = y(); unsigned int gw = w(), gh = h();
      fl = XParseGeometry(geometry, &gx, &gy, &gw, &gh);
      if (fl & XNegative) gx = Fl::w()-w()+gx;
      if (fl & YNegative) gy = Fl::h()-h()+gy;
      //  int mw,mh; minsize(mw,mh);
      //  if (mw > gw) gw = mw;
      //  if (mh > gh) gh = mh;
      Fl_Widget *r = resizable();
      if (!r) resizable(this);
      // for WIN32 we assume window is not mapped yet:
      if (fl & (XValue | YValue))
	x(-1), resize(gx,gy,gw,gh);
      else
	size(gw,gh);
      resizable(r);
    }
  }

  // set the class, which is used by X version of get_system_colors:
  if (name) {xclass(name); name = 0;}
  else if (!xclass()) xclass(fl_filename_name(argv[0]));

  if (title) {label(title); title = 0;}
  else if (!label()) label(xclass());

  if (!beenhere) {
    beenhere = 1;
    Fl::scheme(Fl::scheme()); // opens display!  May call Fl::fatal()
  }

  // Show the window AFTER we have set the colors and scheme.
  show();

#if !defined(WIN32) && !defined(__APPLE__)
  // set the command string, used by state-saving window managers:
  int j;
  int n=0; for (j=0; j<argc; j++) n += strlen(argv[j])+1;
  char *buffer = new char[n];
  char *p = buffer;
  for (j=0; j<argc; j++) for (const char *q = argv[j]; (*p++ = *q++););
  XChangeProperty(fl_display, fl_xid(this), XA_WM_COMMAND, XA_STRING, 8, 0,
		  (unsigned char *)buffer, p-buffer-1);
  delete[] buffer;
#endif // !WIN32 && !__APPLE__
}